

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O1

void __thiscall
ClCommandLine_DoubleDashSwitchToPositional_Test::TestBody
          (ClCommandLine_DoubleDashSwitchToPositional_Test *this)

{
  bool bVar1;
  uint uVar2;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  string_stream output;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  p;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  opt;
  string_stream errors;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  undefined1 local_4c0 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  AssertHelper local_4a0;
  string local_498 [3];
  ios_base local_428 [264];
  option local_320;
  parser<std::__cxx11::string,void> local_298 [32];
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_260;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[4]>(&local_260,(char (*) [4])0x17dd45);
  pstore::command_line::
  list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  list<char[6],pstore::command_line::details::positional>
            ((list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             &local_320,(char (*) [6])"names",(positional *)&pstore::command_line::positional);
  local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"progname","");
  (anonymous_namespace)::ClCommandLine::add<char_const*,char_const*,char_const*>
            ((ClCommandLine *)this,local_498,"--","-opt","foo");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__cxx11::ostringstream::ostringstream(local_198);
  bVar1 = anon_unknown.dwarf_26ec6::ClCommandLine::parse_command_line_options
                    (&this->super_ClCommandLine,(string_stream *)local_498,
                     (string_stream *)local_198);
  local_4d0._M_head_impl._0_1_ = (internal)bVar1;
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4c0,(internal *)&local_4d0,(AssertionResult *)0x185020,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c2,(char *)CONCAT71(local_4c0._1_7_,local_4c0[0]));
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &local_4b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_4c0._1_7_,local_4c0[0]),local_4b0._M_allocated_capacity + 1)
      ;
    }
    if (local_4d8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_4d8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_4c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c8,local_4c8);
  }
  std::__cxx11::stringbuf::str();
  local_4d8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_4b8._M_head_impl;
  local_4a0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_4d0,"errors.str ().length ()","0U",(unsigned_long *)&local_4d8,
             (uint *)&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &local_4b0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_4c0._1_7_,local_4c0[0]),local_4b0._M_allocated_capacity + 1);
  }
  if (local_4d0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_4c0);
    if (local_4c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_4c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((long *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_4c0._1_7_,local_4c0[0]) + 8))();
    }
  }
  if (local_4c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c8,local_4c8);
  }
  std::__cxx11::stringbuf::str();
  local_4d8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )local_4b8._M_head_impl;
  local_4a0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_4d0,"output.str ().length ()","0U",(unsigned_long *)&local_4d8,
             (uint *)&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &local_4b0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_4c0._1_7_,local_4c0[0]),local_4b0._M_allocated_capacity + 1);
  }
  if (local_4d0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_4c0);
    if (local_4c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_4c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((long *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_4c0._1_7_,local_4c0[0]) + 8))();
    }
  }
  if (local_4c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c8,local_4c8);
  }
  uVar2 = pstore::command_line::option::get_num_occurrences(&local_260.super_option);
  local_4d0._M_head_impl._0_4_ = uVar2;
  local_4d8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )((ulong)local_4d8._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_4c0,"opt.get_num_occurrences ()","0U",(uint *)&local_4d0,
             (uint *)&local_4d8);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_4b8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if (local_4d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8._M_head_impl);
  }
  pcVar3 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_4c0,"opt.get ()","\"\"",&local_260.value_,(char (*) [1])0x180d7e);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((_Alloc_hider *)&(local_4b8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if (local_4d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8._M_head_impl);
  }
  local_4d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17dd49;
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17dd44;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_4c0,(char *)&local_4d0,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *)0x181dbe);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)&(local_4b8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x1c9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if (local_4d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8._M_head_impl);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_278);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser(local_298);
  pstore::command_line::option::~option(&local_320);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_260);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashSwitchToPositional) {
    opt<std::string> opt{"opt"};
    list<std::string> p{"names", positional};

    this->add ("progname", "--", "-opt", "foo");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt.get_num_occurrences (), 0U);
    EXPECT_EQ (opt.get (), "");
    EXPECT_THAT (p, ::testing::ElementsAre ("-opt", "foo"));
}